

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O1

void __thiscall World::SetWorldSize(World *this,int width,int height)

{
  pointer pvVar1;
  vector<Tiles,_std::allocator<Tiles>_> *pvVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  vector<Tiles,_std::allocator<Tiles>_> *this_00;
  
  this->worldHeight = height;
  this->worldWidth = width;
  std::
  vector<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
  ::resize(&this->world,(long)height);
  if (0 < height) {
    uVar5 = 0;
    do {
      pvVar1 = (this->world).
               super__Vector_base<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->world).
                     super__Vector_base<std::vector<Tiles,_std::allocator<Tiles>_>,_std::allocator<std::vector<Tiles,_std::allocator<Tiles>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
        pcVar4 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
        pvVar2 = *(vector<Tiles,_std::allocator<Tiles>_> **)(pcVar4 + 8);
        for (this_00 = *(vector<Tiles,_std::allocator<Tiles>_> **)pcVar4; this_00 != pvVar2;
            this_00 = this_00 + 1) {
          std::vector<Tiles,_std::allocator<Tiles>_>::~vector(this_00);
        }
        if (*(void **)pcVar4 != (void *)0x0) {
          operator_delete(*(void **)pcVar4);
          return;
        }
        return;
      }
      std::vector<Tiles,_std::allocator<Tiles>_>::resize(pvVar1 + uVar5,(long)width);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)height);
  }
  return;
}

Assistant:

void World::SetWorldSize(int width, int height)
{
	worldHeight = height;
	worldWidth = width;

	world.resize(height);
	for (int i = 0; i < height; ++i)
	{
		world.at(i).resize(width);
	}
}